

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree.cxx
# Opt level: O2

char ** parse_path(char *path)

{
  size_t sVar1;
  char *pcVar2;
  char **ppcVar3;
  char **ppcVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  char cVar8;
  char *pcVar9;
  long lVar10;
  char cVar11;
  
  sVar1 = strlen(path);
  pcVar2 = (char *)operator_new__(sVar1 + 1);
  ppcVar3 = (char **)operator_new__(-(ulong)(sVar1 + 1 >> 0x3d != 0) | sVar1 * 8 + 8);
  pcVar6 = pcVar2;
  pcVar5 = pcVar2;
  ppcVar4 = ppcVar3;
LAB_001d4ab7:
  do {
    cVar8 = *path;
    pcVar9 = path;
    do {
      path = pcVar9 + 1;
      if (cVar8 != '\\') {
        if ((cVar8 == '/') || (lVar10 = 1, cVar11 = cVar8, cVar8 == '\0')) {
          pcVar7 = pcVar5;
          if (pcVar5 != pcVar6) {
            *pcVar6 = '\0';
            pcVar7 = pcVar6 + 1;
            *ppcVar4 = pcVar5;
            ppcVar4 = ppcVar4 + 1;
            cVar8 = *pcVar9;
          }
          pcVar6 = pcVar7;
          pcVar5 = pcVar7;
          if (cVar8 == '\0') {
            *ppcVar4 = (char *)0x0;
            if (ppcVar4 == ppcVar3) {
              operator_delete__(pcVar2);
            }
            return ppcVar3;
          }
          goto LAB_001d4ab7;
        }
        break;
      }
      cVar11 = *path;
      cVar8 = '\0';
      lVar10 = 2;
      pcVar9 = path;
    } while (cVar11 == '\0');
    path = path + lVar10 + -1;
    *pcVar6 = cVar11;
    pcVar6 = pcVar6 + 1;
  } while( true );
}

Assistant:

static char **parse_path(const char *path) {
  size_t len = strlen(path);
  char *cp = new char[(len+1)], *word = cp, *s = cp; // freed below or in free_path()
  char **ap = new char*[(len+1)], **arr = ap;	     // overallocates arr[]
  while (1) {
    if (*path =='/' || *path == 0) {		// handle path sep or eos
      if (word != s) { *s++ = 0; *arr++= word; word = s; }
      if ( !*path++) break; else continue;	// eos? done, else cont
    } else if ( *path == '\\' ) {		// handle escape
      if ( *(++path) ) { *s++ = *path++; } else continue;
    } else { *s++ = *path++; }			// handle normal char
  }
  *arr = 0;
  if ( arr == ap ) delete[] cp;	// empty arr[]? delete since free_path() can't
  return ap;
}